

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O2

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
               (cmGeneratorTarget *target,ostream *os,ImportPropertyMap *properties,
               GenerateType type,string *config)

{
  _Rb_tree_node_base *__lhs;
  _Rb_tree_node_base *p_Var1;
  cmMakefile *this;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  PolicyStatus PVar6;
  TargetType TVar7;
  ostream *poVar8;
  string *psVar9;
  cmLinkInterfaceLibraries *pcVar10;
  _Base_ptr p_Var11;
  cmLinkImplementation *pcVar12;
  pointer this_01;
  char *pcVar13;
  string *psVar14;
  string *i;
  _Alloc_hider _Var15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string_view str;
  string_view str_00;
  string_view glue;
  string sharedLibs;
  string ldlibs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  psVar14 = config;
  PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0022(target);
  if ((PVar6 == WARN) || (PVar6 = cmGeneratorTarget::GetPolicyStatusCMP0022(target), PVar6 == OLD))
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    pcVar13 = "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    if (type == BUILD) {
      pcVar13 = "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    }
    std::operator<<((ostream *)&w,pcVar13);
    poVar8 = std::operator<<((ostream *)&w," set to OLD for target ");
    psVar9 = cmTarget::GetName_abi_cxx11_(target->Target);
    poVar8 = std::operator<<(poVar8,(string *)psVar9);
    poVar8 = std::operator<<(poVar8,". ");
    std::operator<<(poVar8,"The export will only work with CMP0022 set to NEW.");
    this = target->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(this,AUTHOR_WARNING,&sharedLibs);
    std::__cxx11::string::~string((string *)&sharedLibs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
  }
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<(os,"LOCAL_CPP_FEATURES := rtti exceptions\n");
    for (p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &(properties->_M_t)._M_impl.super__Rb_tree_header;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      __lhs = p_Var11 + 1;
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"INTERFACE_COMPILE_OPTIONS");
      if (bVar4) {
        std::operator<<(os,"LOCAL_CPP_FEATURES += ");
        poVar8 = std::operator<<(os,(string *)(p_Var11 + 2));
        std::operator<<(poVar8,"\n");
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,"INTERFACE_LINK_LIBRARIES");
        if (bVar4) {
          _w = (pointer)local_198;
          sharedLibs._M_dataplus._M_p = (pointer)&sharedLibs.field_2;
          sharedLibs._M_string_length = 0;
          local_198[0]._M_local_buf[0] = '\0';
          sharedLibs.field_2._M_local_buf[0] = '\0';
          ldlibs._M_dataplus._M_p = (pointer)&ldlibs.field_2;
          ldlibs._M_string_length = 0;
          ldlibs.field_2._M_local_buf[0] = '\0';
          pcVar10 = cmGeneratorTarget::GetLinkInterfaceLibraries(target,config,target,Link);
          pcVar2 = (pcVar10->Libraries).super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (this_01 = (pcVar10->Libraries).
                         super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                         super__Vector_impl_data._M_start; this_01 != pcVar2; this_01 = this_01 + 1)
          {
            this_00 = this_01->Target;
            psVar9 = cmLinkItem::AsStr_abi_cxx11_(this_01);
            if (this_00 == (cmGeneratorTarget *)0x0) {
              if (type == INSTALL) {
                str._M_str = (psVar9->_M_dataplus)._M_p;
                str._M_len = psVar9->_M_string_length;
                bVar4 = cmHasLiteralPrefix<4ul>(str,(char (*) [4])0x77f6d8);
              }
              else {
                bVar4 = false;
              }
              bVar5 = cmsys::SystemTools::FileIsFullPath(psVar9);
              if ((bVar5) ||
                 (str_00._M_str = (psVar9->_M_dataplus)._M_p,
                 str_00._M_len = psVar9->_M_string_length,
                 bVar5 = cmHasLiteralPrefix<3ul>(str_00,(char (*) [3])0x7cf465),
                 (bVar4 | bVar5) == 1)) {
                std::operator+(&local_1c8," ",psVar9);
                std::__cxx11::string::append((string *)&ldlibs);
                goto LAB_0048eb66;
              }
              if (psVar9->_M_string_length != 0) {
                std::operator+(&local_1c8," -l",psVar9);
                std::__cxx11::string::append((string *)&ldlibs);
                goto LAB_0048eb66;
              }
            }
            else {
              TVar7 = cmGeneratorTarget::GetType(this_00);
              if ((TVar7 == SHARED_LIBRARY) ||
                 (TVar7 = cmGeneratorTarget::GetType(this_00), TVar7 == MODULE_LIBRARY)) {
                std::operator+(&local_1c8," ",psVar9);
                std::__cxx11::string::append((string *)&sharedLibs);
              }
              else {
                std::operator+(&local_1c8," ",psVar9);
                std::__cxx11::string::append((string *)&w);
              }
LAB_0048eb66:
              std::__cxx11::string::~string((string *)&local_1c8);
            }
          }
          if (sharedLibs._M_string_length != 0) {
            poVar8 = std::operator<<(os,"LOCAL_SHARED_LIBRARIES :=");
            poVar8 = std::operator<<(poVar8,(string *)&sharedLibs);
            std::operator<<(poVar8,"\n");
          }
          if (ldlibs._M_string_length != 0) {
            poVar8 = std::operator<<(os,"LOCAL_EXPORT_LDLIBS :=");
            poVar8 = std::operator<<(poVar8,(string *)&ldlibs);
            std::operator<<(poVar8,"\n");
          }
          std::__cxx11::string::~string((string *)&ldlibs);
          std::__cxx11::string::~string((string *)&sharedLibs);
          std::__cxx11::string::~string((string *)&w);
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"INTERFACE_INCLUDE_DIRECTORIES");
          p_Var1 = p_Var11 + 2;
          if (bVar4) {
            std::__cxx11::string::string((string *)&w,(string *)p_Var1);
            std::__cxx11::string::string((string *)&sharedLibs,(string *)&w);
            init._M_len = 1;
            init._M_array = &sharedLibs;
            cmList::cmList((cmList *)&ldlibs,init);
            std::__cxx11::string::~string((string *)&sharedLibs);
            std::operator<<(os,"LOCAL_EXPORT_C_INCLUDES := ");
            sVar3 = ldlibs._M_string_length;
            sharedLibs._M_dataplus._M_p = (pointer)&sharedLibs.field_2;
            sharedLibs._M_string_length = 0;
            sharedLibs.field_2._M_local_buf[0] = '\0';
            for (_Var15 = ldlibs._M_dataplus; _Var15._M_p != (pointer)sVar3;
                _Var15._M_p = _Var15._M_p + 0x20) {
              poVar8 = std::operator<<(os,(string *)&sharedLibs);
              std::operator<<(poVar8,(string *)_Var15._M_p);
              std::__cxx11::string::assign((char *)&sharedLibs);
            }
            std::operator<<(os,"\n");
            std::__cxx11::string::~string((string *)&sharedLibs);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&ldlibs);
            std::__cxx11::string::~string((string *)&w);
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"INTERFACE_LINK_OPTIONS");
            if (bVar4) {
              std::operator<<(os,"LOCAL_EXPORT_LDFLAGS := ");
              std::__cxx11::string::string((string *)&w,(string *)p_Var1);
              init_00._M_len = 1;
              init_00._M_array = (string *)&w;
              cmList::cmList((cmList *)&sharedLibs,init_00);
              std::__cxx11::string::~string((string *)&w);
              glue._M_str = (char *)psVar14;
              glue._M_len = (size_t)" ";
              cmList::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)&w,(cmList *)&sharedLibs,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&DAT_00000001,glue);
              poVar8 = std::operator<<(os,(string *)&w);
              std::operator<<(poVar8,"\n");
              std::__cxx11::string::~string((string *)&w);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&sharedLibs);
            }
            else {
              poVar8 = std::operator<<(os,"# ");
              poVar8 = std::operator<<(poVar8,(string *)__lhs);
              poVar8 = std::operator<<(poVar8," ");
              poVar8 = std::operator<<(poVar8,(string *)p_Var1);
              std::operator<<(poVar8,"\n");
            }
          }
        }
      }
    }
  }
  TVar7 = cmGeneratorTarget::GetType(target);
  if (TVar7 == STATIC_LIBRARY) {
    pcVar12 = cmGeneratorTarget::GetLinkImplementation(target,config,Link);
    bVar4 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char[4],_0>
                      (&pcVar12->Languages,(char (*) [4])0x79620a);
    if (bVar4) {
      std::operator<<(os,"LOCAL_HAS_CPP := true\n");
    }
  }
  TVar7 = cmGeneratorTarget::GetType(target);
  if (TVar7 - STATIC_LIBRARY < 3) {
    std::operator<<(os,&DAT_007cf584 + *(int *)(&DAT_007cf584 + (ulong)(TVar7 - STATIC_LIBRARY) * 4)
                   );
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
  const cmGeneratorTarget* target, std::ostream& os,
  const ImportPropertyMap& properties, GenerateType type,
  std::string const& config)
{
  const bool newCMP0022Behavior =
    target->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
    target->GetPolicyStatusCMP0022() != cmPolicies::OLD;
  if (!newCMP0022Behavior) {
    std::ostringstream w;
    if (type == cmExportBuildAndroidMKGenerator::BUILD) {
      w << "export(TARGETS ... ANDROID_MK) called with policy CMP0022";
    } else {
      w << "install( EXPORT_ANDROID_MK ...) called with policy CMP0022";
    }
    w << " set to OLD for target " << target->Target->GetName() << ". "
      << "The export will only work with CMP0022 set to NEW.";
    target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
  }
  if (!properties.empty()) {
    os << "LOCAL_CPP_FEATURES := rtti exceptions\n";
    for (auto const& property : properties) {
      if (property.first == "INTERFACE_COMPILE_OPTIONS") {
        os << "LOCAL_CPP_FEATURES += ";
        os << (property.second) << "\n";
      } else if (property.first == "INTERFACE_LINK_LIBRARIES") {
        std::string staticLibs;
        std::string sharedLibs;
        std::string ldlibs;
        cmLinkInterfaceLibraries const* linkIFace =
          target->GetLinkInterfaceLibraries(
            config, target, cmGeneratorTarget::LinkInterfaceFor::Link);
        for (cmLinkItem const& item : linkIFace->Libraries) {
          cmGeneratorTarget const* gt = item.Target;
          std::string const& lib = item.AsStr();
          if (gt) {

            if (gt->GetType() == cmStateEnums::SHARED_LIBRARY ||
                gt->GetType() == cmStateEnums::MODULE_LIBRARY) {
              sharedLibs += " " + lib;
            } else {
              staticLibs += " " + lib;
            }
          } else {
            bool relpath = false;
            if (type == cmExportBuildAndroidMKGenerator::INSTALL) {
              relpath = cmHasLiteralPrefix(lib, "../");
            }
            // check for full path or if it already has a -l, or
            // in the case of an install check for relative paths
            // if it is full or a link library then use string directly
            if (cmSystemTools::FileIsFullPath(lib) ||
                cmHasLiteralPrefix(lib, "-l") || relpath) {
              ldlibs += " " + lib;
              // if it is not a path and does not have a -l then add -l
            } else if (!lib.empty()) {
              ldlibs += " -l" + lib;
            }
          }
        }
        if (!sharedLibs.empty()) {
          os << "LOCAL_SHARED_LIBRARIES :=" << sharedLibs << "\n";
        }
        if (!staticLibs.empty()) {
          os << "LOCAL_STATIC_LIBRARIES :=" << staticLibs << "\n";
        }
        if (!ldlibs.empty()) {
          os << "LOCAL_EXPORT_LDLIBS :=" << ldlibs << "\n";
        }
      } else if (property.first == "INTERFACE_INCLUDE_DIRECTORIES") {
        std::string includes = property.second;
        cmList includeList{ includes };
        os << "LOCAL_EXPORT_C_INCLUDES := ";
        std::string end;
        for (std::string const& i : includeList) {
          os << end << i;
          end = "\\\n";
        }
        os << "\n";
      } else if (property.first == "INTERFACE_LINK_OPTIONS") {
        os << "LOCAL_EXPORT_LDFLAGS := ";
        cmList linkFlagsList{ property.second };
        os << linkFlagsList.join(" ") << "\n";
      } else {
        os << "# " << property.first << " " << (property.second) << "\n";
      }
    }
  }

  // Tell the NDK build system if prebuilt static libraries use C++.
  if (target->GetType() == cmStateEnums::STATIC_LIBRARY) {
    cmLinkImplementation const* li = target->GetLinkImplementation(
      config, cmGeneratorTarget::LinkInterfaceFor::Link);
    if (cm::contains(li->Languages, "CXX")) {
      os << "LOCAL_HAS_CPP := true\n";
    }
  }

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
      os << "include $(PREBUILT_SHARED_LIBRARY)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "include $(PREBUILT_STATIC_LIBRARY)\n";
      break;
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::UTILITY:
    case cmStateEnums::OBJECT_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
  os << "\n";
}